

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileSystemFilter.h
# Opt level: O1

void __thiscall Assimp::FileSystemFilter::~FileSystemFilter(FileSystemFilter *this)

{
  ~FileSystemFilter(this);
  Intern::AllocateFromAssimpHeap::operator_delete(this);
  return;
}

Assistant:

~FileSystemFilter() {
        // empty
    }